

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

void Llb_MnxCheckNextStateVars(Llb_Mnx_t *p)

{
  Vec_Ptr_t *p_00;
  Aig_Man_t *p_01;
  int iVar1;
  uint uVar2;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj_01;
  uint local_24;
  uint local_20;
  int Counter1;
  int Counter0;
  int i;
  Aig_Obj_t *pObj;
  Llb_Mnx_t *p_local;
  
  local_20 = 0;
  local_24 = 0;
  for (Counter1 = 0; iVar1 = Saig_ManRegNum(p->pAig), Counter1 < iVar1; Counter1 = Counter1 + 1) {
    p_00 = p->pAig->vCos;
    iVar1 = Saig_ManPoNum(p->pAig);
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p_00,Counter1 + iVar1);
    p_01 = p->pAig;
    pObj_01 = Aig_ObjFanin0(pObj_00);
    iVar1 = Saig_ObjIsLo(p_01,pObj_01);
    if (iVar1 != 0) {
      iVar1 = Aig_ObjFaninC0(pObj_00);
      if (iVar1 == 0) {
        local_24 = local_24 + 1;
      }
      else {
        local_20 = local_20 + 1;
      }
    }
  }
  uVar2 = Aig_ManRegNum(p->pAig);
  printf("Total = %d.  Direct LO = %d. Compl LO = %d.\n",(ulong)uVar2,(ulong)local_24,
         (ulong)local_20);
  return;
}

Assistant:

void Llb_MnxCheckNextStateVars( Llb_Mnx_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter0 = 0, Counter1 = 0;
    Saig_ManForEachLi( p->pAig, pObj, i )
        if ( Saig_ObjIsLo(p->pAig, Aig_ObjFanin0(pObj)) )
        {
            if ( Aig_ObjFaninC0(pObj) )
                Counter0++;
            else
                Counter1++;
        }
    printf( "Total = %d.  Direct LO = %d. Compl LO = %d.\n", Aig_ManRegNum(p->pAig), Counter1, Counter0 );
}